

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O1

void __thiscall
ncnn::Crop::resolve_crop_roi
          (Crop *this,Mat *bottom_blob,Mat *reference_blob,int *_woffset,int *_hoffset,int *_coffset
          ,int *_outw,int *_outh,int *_outc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = bottom_blob->dims;
  iVar2 = reference_blob->w;
  iVar3 = reference_blob->h;
  if (iVar1 == 3) {
    if (reference_blob->dims == 3) {
      bottom_blob = reference_blob;
    }
    iVar1 = bottom_blob->c;
    *_woffset = this->woffset;
    *_hoffset = this->hoffset;
    *_coffset = this->coffset;
    *_outw = iVar2;
    *_outh = iVar3;
    *_outc = iVar1;
  }
  else if (iVar1 == 2) {
    *_woffset = this->woffset;
    *_hoffset = this->hoffset;
    *_outw = iVar2;
    *_outh = iVar3;
  }
  else if (iVar1 == 1) {
    *_woffset = this->woffset;
    *_outw = iVar2;
  }
  return;
}

Assistant:

void Crop::resolve_crop_roi(const Mat& bottom_blob, const Mat& reference_blob, int& _woffset, int& _hoffset, int& _coffset, int& _outw, int& _outh, int& _outc) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    int ref_w = reference_blob.w;
    int ref_h = reference_blob.h;
    int ref_channels = reference_blob.c;
    int ref_dims = reference_blob.dims;

    if (dims == 1)
    {
        _woffset = woffset;
        _outw = ref_w;
    }
    if (dims == 2)
    {
        _woffset = woffset;
        _hoffset = hoffset;
        _outw = ref_w;
        _outh = ref_h;
    }
    if (dims == 3)
    {
        _woffset = woffset;
        _hoffset = hoffset;
        _coffset = coffset;
        _outw = ref_w;
        _outh = ref_h;
        _outc = ref_dims == 3 ? ref_channels : channels;
    }
}